

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# send.hpp
# Opt level: O2

error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>
* __thiscall
pstore::http::
send<pstore::error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&>(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char_const,_1l>const&),std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>
          (error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>
           *__return_storage_ptr__,http *this,
          _func_error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&>_descriptor<pstore::details::posix_descriptor_traits>_ptr_span<const_unsigned_char,__1L>_ptr
          *sender,reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>
                  io,span<const_unsigned_char,__1L> *s)

{
  error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&> eStack_28;
  
  (*(code *)this)(&eStack_28,sender,io._M_data);
  error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>
  ::error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,void>
            (__return_storage_ptr__,&eStack_28);
  error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&>::~error_or
            (&eStack_28);
  return __return_storage_ptr__;
}

Assistant:

error_or<IO> send (Sender sender, IO io, gsl::span<std::uint8_t const> const & s) {
            return sender (io, s);
        }